

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall CP::list<int>::merge(list<int> *this,list<CP::list<int>_> *ls)

{
  node *pnVar1;
  node *pnVar2;
  size_t sVar3;
  node *pnVar4;
  node *pnVar5;
  list<int> *l;
  node *pnVar6;
  list<CP::list<int>_> *__range1;
  
  pnVar1 = ls->mHeader;
  pnVar6 = pnVar1->next;
  if (pnVar1 != pnVar6) {
    pnVar2 = this->mHeader;
    do {
      sVar3 = (pnVar6->data).mSize;
      if (sVar3 != 0) {
        pnVar4 = (pnVar6->data).mHeader;
        pnVar5 = pnVar4->next;
        pnVar5->prev = pnVar2->prev;
        pnVar2->prev->next = pnVar5;
        pnVar5 = pnVar4->prev;
        pnVar5->next = pnVar2;
        pnVar2->prev = pnVar5;
        pnVar4->next = pnVar4;
        pnVar4->prev = pnVar4;
        this->mSize = this->mSize + sVar3;
        (pnVar6->data).mSize = 0;
      }
      pnVar6 = pnVar6->next;
    } while (pnVar1 != pnVar6);
  }
  return;
}

Assistant:

iterator begin() {
      return iterator(mHeader->next);
    }